

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_dataview_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  JSValueUnion JVar6;
  long *plVar7;
  uint uVar8;
  JSRefCountHeader *p_1;
  JSRefCountHeader *p;
  JSValue JVar9;
  uint64_t offset;
  uint64_t l;
  uint64_t local_48;
  ulong local_40;
  ulong local_38;
  
  if (((int)argv->tag == -1) &&
     (piVar1 = (int *)(argv->u).ptr, (ushort)(*(short *)((long)piVar1 + 6) - 0x13U) < 2)) {
    piVar2 = *(int **)(piVar1 + 0xc);
    if ((piVar2 != (int *)0x0) &&
       ((local_48 = 0, argc < 2 || (iVar4 = JS_ToIndex(ctx,&local_48,argv[1]), iVar4 == 0)))) {
      if ((char)piVar2[1] == '\0') {
        if ((ulong)(long)*piVar2 < local_48) {
          JS_ThrowRangeError(ctx,"invalid byteOffset");
        }
        else {
          iVar4 = (int)local_48;
          uVar8 = *piVar2 - iVar4;
          if ((2 < argc) && ((int)argv[2].tag != 3)) {
            JVar9.tag = argv[2].tag;
            JVar9.u.ptr = argv[2].u.ptr;
            local_40 = (ulong)uVar8;
            iVar5 = JS_ToIndex(ctx,&local_38,JVar9);
            if (iVar5 != 0) goto LAB_00131e90;
            if ((local_40 & 0xffffffff) < local_38) {
              JS_ThrowRangeError(ctx,"invalid byteLength");
              goto LAB_00131e90;
            }
            uVar8 = (uint)local_38;
          }
          JVar9 = js_create_from_ctor(ctx,new_target,0x1e);
          JVar6 = JVar9.u;
          if ((uint)JVar9.tag != 6) {
            if ((char)piVar2[1] == '\0') {
              plVar7 = (long *)js_malloc(ctx,0x28);
              if (plVar7 != (long *)0x0) {
                ((JSValueUnion *)(plVar7 + 2))->ptr = (void *)JVar6;
                *piVar1 = *piVar1 + 1;
                plVar7[3] = (long)piVar1;
                *(int *)(plVar7 + 4) = iVar4;
                *(uint *)((long)plVar7 + 0x24) = uVar8;
                lVar3 = *(long *)(piVar2 + 4);
                *(long **)(lVar3 + 8) = plVar7;
                *plVar7 = lVar3;
                plVar7[1] = (long)(piVar2 + 4);
                *(long **)(piVar2 + 4) = plVar7;
                *(long **)((long)JVar6.ptr + 0x30) = plVar7;
                return JVar9;
              }
            }
            else {
              JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
            }
            if ((0xfffffff4 < (uint)JVar9.tag) &&
               (iVar4 = *JVar6.ptr, *(int *)JVar6.ptr = iVar4 + -1, iVar4 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar9);
            }
          }
        }
      }
      else {
        JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
      }
LAB_00131e90:
      return (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,0x13);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_dataview_constructor(JSContext *ctx,
                                       JSValueConst new_target,
                                       int argc, JSValueConst *argv)
{
    JSArrayBuffer *abuf;
    uint64_t offset;
    uint32_t len;
    JSValueConst buffer;
    JSValue obj;
    JSTypedArray *ta;
    JSObject *p;

    buffer = argv[0];
    abuf = js_get_array_buffer(ctx, buffer);
    if (!abuf)
        return JS_EXCEPTION;
    offset = 0;
    if (argc > 1) {
        if (JS_ToIndex(ctx, &offset, argv[1]))
            return JS_EXCEPTION;
    }
    if (abuf->detached)
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    if (offset > abuf->byte_length)
        return JS_ThrowRangeError(ctx, "invalid byteOffset");
    len = abuf->byte_length - offset;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        uint64_t l;
        if (JS_ToIndex(ctx, &l, argv[2]))
            return JS_EXCEPTION;
        if (l > len)
            return JS_ThrowRangeError(ctx, "invalid byteLength");
        len = l;
    }

    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_DATAVIEW);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    if (abuf->detached) {
        /* could have been detached in js_create_from_ctor() */
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        goto fail;
    }
    ta = js_malloc(ctx, sizeof(*ta));
    if (!ta) {
    fail:
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    p = JS_VALUE_GET_OBJ(obj);
    ta->obj = p;
    ta->buffer = JS_VALUE_GET_OBJ(JS_DupValue(ctx, buffer));
    ta->offset = offset;
    ta->length = len;
    list_add_tail(&ta->link, &abuf->array_list);
    p->u.typed_array = ta;
    return obj;
}